

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-copy-mpi.c
# Opt level: O2

void slave(void)

{
  size_t offset;
  int iVar1;
  char *pcVar2;
  char *__format;
  FILE *pFVar3;
  undefined8 uVar4;
  undefined1 local_298 [8];
  BigArray array;
  BigBlockPtr ptrnew;
  MPI_Status status;
  int64_t work [2];
  int result;
  
  work[1]._4_4_ = 0;
  MPI_Send((long)work + 0xc,1,&ompi_mpi_int,0,0x50d,&ompi_mpi_comm_world);
  do {
    MPI_Recv(&status._ucount,1,MPI_TYPE_WORK,0,0xffffffffffffffff,&ompi_mpi_comm_world,
             &ptrnew.aoffset);
    offset = status._ucount;
    if (ptrnew.aoffset._4_4_ == 0x50a) {
      return;
    }
    iVar1 = big_block_read_simple(&bb,status._ucount,work[0],(BigArray *)local_298,(char *)0x0);
    pFVar3 = _stderr;
    if (iVar1 == 0) {
      iVar1 = big_block_seek(&bbnew,(BigBlockPtr *)&array.data,offset);
      pFVar3 = _stderr;
      if (iVar1 == 0) {
        iVar1 = big_block_write(&bbnew,(BigBlockPtr *)&array.data,(BigArray *)local_298);
        pFVar3 = _stderr;
        if (iVar1 == 0) {
          free((void *)array.size);
          uVar4 = 0x50d;
          goto LAB_00103b1e;
        }
        pcVar2 = big_file_get_error_message();
        __format = "failed to write new: %s\n";
      }
      else {
        pcVar2 = big_file_get_error_message();
        __format = "failed to seek new: %s\n";
      }
      fprintf(pFVar3,__format,pcVar2);
      work[1]._4_4_ = 0xffffffff;
      free((void *)array.size);
      uVar4 = 0x50f;
    }
    else {
      pcVar2 = big_file_get_error_message();
      fprintf(pFVar3,"failed to read original: %s\n",pcVar2);
      work[1]._4_4_ = 0xffffffff;
      uVar4 = 0x50f;
    }
LAB_00103b1e:
    MPI_Send((long)work + 0xc,1,&ompi_mpi_int,0,uVar4,&ompi_mpi_comm_world);
  } while( true );
}

Assistant:

void slave() {
    int result = 0;
    MPI_Send(&result, 1, MPI_INT, 0, DONE_TAG, MPI_COMM_WORLD);
    while(1) {
        int64_t work[2];
        MPI_Status status;
        MPI_Recv(work, 1, MPI_TYPE_WORK, 0, MPI_ANY_TAG, MPI_COMM_WORLD, &status);

        if(status.MPI_TAG == DIE_TAG) {
            break;
        }
        int64_t offset = work[0];
        int64_t chunksize = work[1];
        BigArray array;
        BigBlockPtr ptrnew;

        if(0 != big_block_read_simple(&bb, offset, chunksize, &array, NULL)) {
            fprintf(stderr, "failed to read original: %s\n", big_file_get_error_message());
            result = -1;
            goto bad;
        }
        if(0 != big_block_seek(&bbnew, &ptrnew, offset)) {
            fprintf(stderr, "failed to seek new: %s\n", big_file_get_error_message());
            result = -1;
            free(array.data);
            goto bad;
        }

        if(0 != big_block_write(&bbnew, &ptrnew, &array)) {
            fprintf(stderr, "failed to write new: %s\n", big_file_get_error_message());
            result = -1;
            free(array.data);
            goto bad;
        }

        free(array.data);
        MPI_Send(&result, 1, MPI_INT, 0, DONE_TAG, MPI_COMM_WORLD);
        continue;
    bad:
        MPI_Send(&result, 1, MPI_INT, 0, ERROR_TAG, MPI_COMM_WORLD);
        continue;
    }
    return;
}